

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiexsas.c
# Opt level: O0

HTTPAPIEX_SAS_STATE * construct_httpex_sas(char *key,char *uriResource,char *keyName)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  HTTPAPIEX_SAS_STATE *result;
  char *keyName_local;
  char *uriResource_local;
  char *key_local;
  
  l = (LOGGER_LOG)malloc(0x18);
  if ((HTTPAPIEX_SAS_HANDLE)l == (HTTPAPIEX_SAS_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
                ,"construct_httpex_sas",0x21,1,"Failure allocating HTTPAPIEX_SAS_Create.");
    }
  }
  else {
    memset(l,0,0x18);
    iVar1 = mallocAndStrcpy_s((char **)l,key);
    if (iVar1 == 0) {
      iVar1 = mallocAndStrcpy_s(&((HTTPAPIEX_SAS_HANDLE)l)->uriResource,uriResource);
      if (iVar1 == 0) {
        if ((keyName != (char *)0x0) &&
           (iVar1 = mallocAndStrcpy_s(&((HTTPAPIEX_SAS_HANDLE)l)->keyName,keyName), iVar1 != 0)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
                      ,"construct_httpex_sas",0x37,1,"Failure allocating sas keyName.");
          }
          HTTPAPIEX_SAS_Destroy((HTTPAPIEX_SAS_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
                    ,"construct_httpex_sas",0x30,1,"Failure allocating sas uriResource.");
        }
        HTTPAPIEX_SAS_Destroy((HTTPAPIEX_SAS_HANDLE)l);
        l = (LOGGER_LOG)0x0;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
                  ,"construct_httpex_sas",0x29,1,"Failure allocating sas key.");
      }
      HTTPAPIEX_SAS_Destroy((HTTPAPIEX_SAS_HANDLE)l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (HTTPAPIEX_SAS_STATE *)l;
}

Assistant:

static HTTPAPIEX_SAS_STATE* construct_httpex_sas(const char* key, const char* uriResource, const char* keyName)
{
    HTTPAPIEX_SAS_STATE* result;

    result = (HTTPAPIEX_SAS_STATE*)malloc(sizeof(HTTPAPIEX_SAS_STATE));
    if (result == NULL)
    {
        LogError("Failure allocating HTTPAPIEX_SAS_Create.");
    }
    else
    {
        (void)memset(result, 0, sizeof(HTTPAPIEX_SAS_STATE));
        if (mallocAndStrcpy_s(&result->key, key) != 0)
        {
            /*Codes_SRS_HTTPAPIEXSAS_06_004: [If there are any other errors in the instantiation of this handle then HTTPAPIEX_SAS_Create shall return NULL.]*/
            LogError("Failure allocating sas key.");
            HTTPAPIEX_SAS_Destroy(result);
            result = NULL;
        }
        else if (mallocAndStrcpy_s(&result->uriResource, uriResource) != 0)
        {
            /*Codes_SRS_HTTPAPIEXSAS_06_004: [If there are any other errors in the instantiation of this handle then HTTPAPIEX_SAS_Create shall return NULL.]*/
            LogError("Failure allocating sas uriResource.");
            HTTPAPIEX_SAS_Destroy(result);
            result = NULL;
        }
        else if (keyName != NULL && mallocAndStrcpy_s(&result->keyName, keyName) != 0)
        {
            /*Codes_SRS_HTTPAPIEXSAS_06_004: [If there are any other errors in the instantiation of this handle then HTTPAPIEX_SAS_Create shall return NULL.]*/
            LogError("Failure allocating sas keyName.");
            HTTPAPIEX_SAS_Destroy(result);
            result = NULL;
        }
    }
    return result;
}